

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O3

void rsg::assignMasked(ExecValueAccess dst,ExecConstValueAccess src,ExecConstValueAccess mask)

{
  Type TVar1;
  int compNdx;
  int iVar2;
  int iVar3;
  long lVar4;
  VariableType *pVVar5;
  VariableType *pVVar6;
  uint uVar7;
  Scalar *pSVar8;
  VariableType *this;
  int iVar9;
  ulong uVar10;
  Scalar *pSVar11;
  VariableType *this_00;
  int iVar12;
  long lVar13;
  ExecConstValueAccess src_00;
  ExecConstValueAccess src_01;
  ExecValueAccess dst_00;
  ExecValueAccess dst_01;
  
  pSVar11 = dst.super_ConstStridedValueAccess<64>.m_value;
  this_00 = dst.super_ConstStridedValueAccess<64>.m_type;
  pSVar8 = src.m_value;
  this = src.m_type;
  TVar1 = this_00->m_baseType;
  if (TVar1 < TYPE_LAST) {
    if ((0xceU >> (TVar1 & 0x1f) & 1) == 0) {
      if (TVar1 == TYPE_STRUCT) {
        uVar7 = (int)((long)(this_00->m_members).
                            super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->m_members).
                            super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        if (0 < (int)uVar7) {
          lVar13 = 0;
          uVar10 = 0;
          do {
            pVVar5 = *(VariableType **)
                      ((long)&((this_00->m_members).
                               super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar13);
            iVar12 = VariableType::getMemberScalarOffset(this_00,(int)uVar10);
            pVVar6 = *(VariableType **)
                      ((long)&((this->m_members).
                               super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar13);
            iVar9 = VariableType::getMemberScalarOffset(this,(int)uVar10);
            src_01.m_value = pSVar8 + (iVar9 << 6);
            src_01.m_type = pVVar6;
            dst_01.super_ConstStridedValueAccess<64>.m_value = pSVar11 + (iVar12 << 6);
            dst_01.super_ConstStridedValueAccess<64>.m_type = pVVar5;
            assignMasked(dst_01,src_01,mask);
            uVar10 = uVar10 + 1;
            lVar13 = lVar13 + 0x28;
          } while ((uVar7 & 0x7fffffff) != uVar10);
        }
      }
      else if ((TVar1 == TYPE_ARRAY) && (iVar12 = this_00->m_numElements, 0 < iVar12)) {
        iVar9 = 0;
        do {
          pVVar5 = VariableType::getElementType(this_00);
          iVar2 = VariableType::getElementScalarOffset(this_00,iVar9);
          pVVar6 = VariableType::getElementType(this);
          iVar3 = VariableType::getElementScalarOffset(this,iVar9);
          src_00.m_value = pSVar8 + (iVar3 << 6);
          src_00.m_type = pVVar6;
          dst_00.super_ConstStridedValueAccess<64>.m_value = pSVar11 + (iVar2 << 6);
          dst_00.super_ConstStridedValueAccess<64>.m_type = pVVar5;
          assignMasked(dst_00,src_00,mask);
          iVar9 = iVar9 + 1;
        } while (iVar12 != iVar9);
      }
    }
    else if (0 < this_00->m_numElements) {
      iVar12 = 0;
      lVar13 = 0;
      do {
        VariableType::getElementType(this_00);
        VariableType::getElementType(this);
        lVar4 = 0;
        do {
          if (mask.m_value[lVar4].boolVal == true) {
            pSVar11[iVar12 + lVar4] = pSVar8[iVar12 + lVar4];
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x40);
        lVar13 = lVar13 + 1;
        iVar12 = iVar12 + 0x40;
      } while (lVar13 < this_00->m_numElements);
    }
  }
  return;
}

Assistant:

void assignMasked (ExecValueAccess dst, ExecConstValueAccess src, ExecConstValueAccess mask)
{
	const VariableType& type = dst.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_ARRAY:
		{
			int numElems = type.getNumElements();
			for (int elemNdx = 0; elemNdx < numElems; elemNdx++)
				assignMasked(dst.arrayElement(elemNdx), src.arrayElement(elemNdx), mask);

			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)type.getMembers().size();
			for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
				assignMasked(dst.member(memberNdx), src.member(memberNdx), mask);

			break;
		}

		case VariableType::TYPE_FLOAT:
		case VariableType::TYPE_INT:
		case VariableType::TYPE_BOOL:
		case VariableType::TYPE_SAMPLER_2D:
		case VariableType::TYPE_SAMPLER_CUBE:
		{
			for (int elemNdx = 0; elemNdx < type.getNumElements(); elemNdx++)
			{
				ExecValueAccess			dstElem		= dst.component(elemNdx);
				ExecConstValueAccess	srcElem		= src.component(elemNdx);

				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				{
					if (mask.asBool(compNdx))
						dstElem.asScalar(compNdx) = srcElem.asScalar(compNdx);
				}
			}

			break;
		}

		default:
			DE_FATAL("Unsupported");
			break;
	}
}